

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O2

string * kj::_::anon_unknown_0::fileLine(string *__return_storage_ptr__,string *file,int line)

{
  kj *this;
  size_t sVar1;
  size_t extraout_RDX;
  StringPtr filename;
  char buffer [32];
  
  this = (kj *)(file->_M_dataplus)._M_p;
  sVar1 = strlen((char *)this);
  filename.content.size_ = extraout_RDX;
  filename.content.ptr = (char *)(sVar1 + 1);
  trimSourceFilename(this,filename);
  ::std::__cxx11::string::assign((char *)file);
  ::std::__cxx11::string::push_back((char)file);
  sprintf(buffer,"%d",(ulong)(uint)line);
  ::std::__cxx11::string::append((char *)file);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)file);
  return __return_storage_ptr__;
}

Assistant:

std::string fileLine(std::string file, int line) {
  file = trimSourceFilename(file.c_str()).cStr();

  file += ':';
  char buffer[32];
  sprintf(buffer, "%d", line);
  file += buffer;
  return file;
}